

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O2

int __thiscall
jrtplib::RTPTCPTransmitter::DeleteDestination(RTPTCPTransmitter *this,RTPAddress *addr)

{
  _Base_ptr this_00;
  int iVar1;
  iterator __position;
  RTPMemoryManager *mgr;
  SocketType s;
  int local_1c;
  
  iVar1 = -0xb5;
  if (((this->m_init == true) && (iVar1 = -0xbb, this->m_created == true)) &&
     (iVar1 = -0xbc, addr->addresstype == TCPAddress)) {
    local_1c = *(int *)&addr->field_0xc;
    if (local_1c == 0) {
      iVar1 = -0xbd;
    }
    else {
      __position = std::
                   _Rb_tree<int,_std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>,_std::_Select1st<std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>_>,_std::less<int>,_std::allocator<std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>_>_>
                   ::find(&(this->m_destSockets)._M_t,&local_1c);
      if ((_Rb_tree_header *)__position._M_node ==
          &(this->m_destSockets)._M_t._M_impl.super__Rb_tree_header) {
        iVar1 = -0xc3;
      }
      else {
        this_00 = __position._M_node[1]._M_right;
        __position._M_node[1]._M_right = (_Base_ptr)0x0;
        if (this_00 != (_Base_ptr)0x0) {
          RTPDeleteByteArray((jrtplib *)this_00,
                             (uint8_t *)(this->super_RTPTransmitter).super_RTPMemoryObject.mgr,mgr);
        }
        std::
        _Rb_tree<int,std::pair<int_const,jrtplib::RTPTCPTransmitter::SocketData>,std::_Select1st<std::pair<int_const,jrtplib::RTPTCPTransmitter::SocketData>>,std::less<int>,std::allocator<std::pair<int_const,jrtplib::RTPTCPTransmitter::SocketData>>>
        ::erase_abi_cxx11_((_Rb_tree<int,std::pair<int_const,jrtplib::RTPTCPTransmitter::SocketData>,std::_Select1st<std::pair<int_const,jrtplib::RTPTCPTransmitter::SocketData>>,std::less<int>,std::allocator<std::pair<int_const,jrtplib::RTPTCPTransmitter::SocketData>>>
                            *)&this->m_destSockets,__position);
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int RTPTCPTransmitter::DeleteDestination(const RTPAddress &addr)
{
	if (!m_init)
		return ERR_RTP_TCPTRANS_NOTINIT;
	
	MAINMUTEX_LOCK
	
	if (!m_created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_NOTCREATED;
	}
	
	if (addr.GetAddressType() != RTPAddress::TCPAddress)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_INVALIDADDRESSTYPE;
	}

	const RTPTCPAddress &a = static_cast<const RTPTCPAddress &>(addr);
	SocketType s = a.GetSocket();
	if (s == 0)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_NOSOCKETSPECIFIED;
	}

	std::map<SocketType, SocketData>::iterator it = m_destSockets.find(s);
	if (it == m_destSockets.end())
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_SOCKETNOTFOUNDINDESTINATIONS;
	}

	// Clean up possibly allocated memory
	uint8_t *pBuf = it->second.ExtractDataBuffer();
	if (pBuf)
		RTPDeleteByteArray(pBuf, GetMemoryManager());

	m_destSockets.erase(it);

	MAINMUTEX_UNLOCK
	return 0;
}